

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::draw_elements_instanced_base_vertex_invalid_map
               (NegativeTestContext *ctx)

{
  allocator<char> local_39;
  string local_38;
  GLuint local_18;
  undefined1 local_14 [4];
  GLuint buf;
  GLfloat vertices [1];
  NegativeTestContext *ctx_local;
  
  local_18 = 0;
  _buf = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_OPERATION is generated if a non-zero buffer object name is bound to an enabled array or the element array and the buffer object\'s data store is currently mapped."
             ,&local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glGenBuffers(&_buf->super_CallLogWrapper,1,&local_18);
  glu::CallLogWrapper::glBindBuffer(&_buf->super_CallLogWrapper,0x8893,local_18);
  glu::CallLogWrapper::glBufferData(&_buf->super_CallLogWrapper,0x8893,10,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glMapBufferRange(&_buf->super_CallLogWrapper,0x8893,0,5,1);
  NegativeTestContext::expectError(_buf,0);
  glu::CallLogWrapper::glDrawElementsInstancedBaseVertex
            (&_buf->super_CallLogWrapper,0,1,0x1405,local_14,1,1);
  NegativeTestContext::expectError(_buf,0x502);
  glu::CallLogWrapper::glUnmapBuffer(&_buf->super_CallLogWrapper,0x8893);
  glu::CallLogWrapper::glDeleteBuffers(&_buf->super_CallLogWrapper,1,&local_18);
  NegativeTestContext::endSection(_buf);
  return;
}

Assistant:

void draw_elements_instanced_base_vertex_invalid_map (NegativeTestContext& ctx)
{
	GLfloat						vertices[1];
	GLuint						buf		= 0;

	ctx.beginSection("GL_INVALID_OPERATION is generated if a non-zero buffer object name is bound to an enabled array or the element array and the buffer object's data store is currently mapped.");
	ctx.glGenBuffers(1, &buf);
	ctx.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, buf);
	ctx.glBufferData(GL_ELEMENT_ARRAY_BUFFER, 10, 0, GL_STATIC_DRAW);
	ctx.glMapBufferRange(GL_ELEMENT_ARRAY_BUFFER, 0, 5, GL_MAP_READ_BIT);
	ctx.expectError(GL_NO_ERROR);
	ctx.glDrawElementsInstancedBaseVertex(GL_POINTS, 1, GL_UNSIGNED_INT, vertices, 1, 1);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUnmapBuffer(GL_ELEMENT_ARRAY_BUFFER);
	ctx.glDeleteBuffers(1, &buf);
	ctx.endSection();

}